

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::readOneAndConvert
          (CompilerMain *this,BufferedInputStreamWrapper *input,OutputStream *output)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder output_00;
  Reader reader_03;
  Builder output_01;
  Reader reader_04;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  word *__dest;
  uchar *puVar4;
  uchar *__nbytes;
  void *__buf;
  ArrayPtr<const_capnp::word> AVar5;
  ArrayPtr<const_unsigned_char> AVar6;
  ArrayPtr<unsigned_char> AVar7;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  ReaderOptions options_03;
  Reader local_c80;
  Reader local_c48;
  RawBrandedSchema *local_c18;
  Schema SStack_c10;
  SegmentBuilder *local_c08;
  CapTableBuilder *pCStack_c00;
  void *local_bf8;
  WirePointer *pWStack_bf0;
  ArrayPtr<const_char> local_be8;
  Schema local_bd8;
  undefined1 auStack_bd0 [8];
  Builder root_1;
  undefined1 local_b98 [8];
  JsonCodec codec_1;
  MallocMessageBuilder message_5;
  String text_1;
  Reader local_a48;
  Schema local_a18;
  Schema SStack_a10;
  SegmentBuilder *local_a08;
  CapTableBuilder *pCStack_a00;
  void *local_9f8;
  WirePointer *pWStack_9f0;
  ArrayPtr<const_char> local_9e0;
  Schema local_9d0;
  undefined1 auStack_9c8 [8];
  Builder root;
  undefined1 local_990 [7];
  TextCodec codec;
  MallocMessageBuilder message_4;
  String text;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_840;
  undefined1 local_830 [8];
  SegmentArrayMessageReader message_3;
  ArrayPtr<const_capnp::word> segments_1 [1];
  Fault local_730;
  Fault f_1;
  word dummy;
  ArrayPtr<unsigned_char> local_710;
  undefined1 local_700 [8];
  PackedInputStream unpacker;
  undefined1 local_6e0 [8];
  ArrayInputStream input_1;
  undefined1 local_6b8 [8];
  Array<capnp::word> words_1;
  Vector<unsigned_char> allBytes_1;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  Fault local_650;
  Fault f;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_630;
  undefined1 local_620 [8];
  SegmentArrayMessageReader message_2;
  ArrayPtr<const_capnp::word> segments [1];
  undefined1 local_520 [8];
  Array<capnp::word> words;
  Vector<unsigned_char> allBytes;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  ArrayPtr<capnp::word> local_4b8;
  UnwindDetector local_4a8;
  undefined4 uStack_4a4;
  int iStack_4a0;
  undefined1 local_490 [8];
  PackedMessageReader message_1;
  Reader local_348;
  ArrayPtr<capnp::word> local_308;
  UnwindDetector local_2f8;
  undefined4 uStack_2f4;
  int iStack_2f0;
  undefined1 local_2e0 [8];
  InputStreamMessageReader message;
  ParseErrorCatcher parseErrorCatcher;
  ReaderOptions options;
  OutputStream *output_local;
  BufferedInputStreamWrapper *input_local;
  CompilerMain *this_local;
  
  ReaderOptions::ReaderOptions((ReaderOptions *)&parseErrorCatcher.unwindDetector);
  iVar2 = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  parseErrorCatcher._376_8_ =
       kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
  ParseErrorCatcher::ParseErrorCatcher((ParseErrorCatcher *)&message.unwindDetector,this->context);
  switch(this->convertFrom) {
  case BINARY:
    local_2f8.uncaughtCount = parseErrorCatcher.unwindDetector.uncaughtCount;
    uStack_2f4 = parseErrorCatcher._380_4_;
    iStack_2f0 = iVar2;
    kj::ArrayPtr<capnp::word>::ArrayPtr(&local_308,(void *)0x0);
    options_02.nestingLimit = iStack_2f0;
    options_02.traversalLimitInWords = _local_2f8;
    options_02._12_4_ = 0;
    InputStreamMessageReader::InputStreamMessageReader
              ((InputStreamMessageReader *)local_2e0,(InputStream *)input,options_02,local_308);
    MessageReader::getRoot<capnp::AnyStruct>(&local_348,(MessageReader *)local_2e0);
    reader._reader.capTable = local_348._reader.capTable;
    reader._reader.segment = local_348._reader.segment;
    reader._reader.data = local_348._reader.data;
    reader._reader.pointers = local_348._reader.pointers;
    reader._reader.dataSize = local_348._reader.dataSize;
    reader._reader.pointerCount = local_348._reader.pointerCount;
    reader._reader._38_2_ = local_348._reader._38_2_;
    reader._reader.nestingLimit = local_348._reader.nestingLimit;
    reader._reader._44_4_ = local_348._reader._44_4_;
    writeConversion(this,reader,output);
    message_1.super_InputStreamMessageReader._300_4_ = 1;
    InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)local_2e0);
    break;
  case PACKED:
    local_4a8.uncaughtCount = parseErrorCatcher.unwindDetector.uncaughtCount;
    uStack_4a4 = parseErrorCatcher._380_4_;
    iStack_4a0 = iVar2;
    kj::ArrayPtr<capnp::word>::ArrayPtr(&local_4b8,(void *)0x0);
    options_03.nestingLimit = iStack_4a0;
    options_03.traversalLimitInWords = _local_4a8;
    options_03._12_4_ = 0;
    PackedMessageReader::PackedMessageReader
              ((PackedMessageReader *)local_490,&input->super_BufferedInputStream,options_03,
               local_4b8);
    MessageReader::getRoot<capnp::AnyStruct>
              ((Reader *)&allBytes.builder.disposer,
               (MessageReader *)&message_1.super_PackedInputStream.inner);
    reader_00._reader.capTable = (CapTableReader *)uStack_4e0;
    reader_00._reader.segment = (SegmentReader *)allBytes.builder.disposer;
    reader_00._reader.data = (void *)local_4d8;
    reader_00._reader.pointers = (WirePointer *)uStack_4d0;
    reader_00._reader._32_8_ = local_4c8;
    reader_00._reader._40_8_ = uStack_4c0;
    writeConversion(this,reader_00,output);
    message_1.super_InputStreamMessageReader._300_4_ = 1;
    PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_490);
    break;
  case FLAT:
  case CANONICAL:
    readAll((Vector<unsigned_char> *)&words.disposer,this,input);
    sVar3 = kj::Vector<unsigned_char>::size((Vector<unsigned_char> *)&words.disposer);
    kj::heapArray<capnp::word>((Array<capnp::word> *)local_520,sVar3 >> 3);
    __dest = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_520);
    puVar4 = kj::Vector<unsigned_char>::begin((Vector<unsigned_char> *)&words.disposer);
    sVar3 = kj::Array<capnp::word>::size((Array<capnp::word> *)local_520);
    memcpy(__dest,puVar4,sVar3 << 3);
    AVar5 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_520);
    message_2.segments.size_ = (size_t)AVar5.ptr;
    kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>::ArrayPtr<1ul>
              ((ArrayPtr<kj::ArrayPtr<capnp::word_const>const> *)&local_630,
               (ArrayPtr<const_capnp::word> (*) [1])&message_2.segments.size_);
    f.exception = (Exception *)parseErrorCatcher._376_8_;
    options_00.nestingLimit = iVar2;
    options_00.traversalLimitInWords = parseErrorCatcher._376_8_;
    options_00._12_4_ = 0;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_620,local_630,options_00);
    if ((this->convertFrom == CANONICAL) &&
       (bVar1 = MessageReader::isCanonical((MessageReader *)local_620), !bVar1)) {
      kj::_::Debug::Fault::Fault
                (&local_650,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x402,FAILED,"message.isCanonical()","");
      kj::_::Debug::Fault::fatal(&local_650);
    }
    MessageReader::getRoot<capnp::AnyStruct>
              ((Reader *)&allBytes_1.builder.disposer,(MessageReader *)local_620);
    reader_01._reader.capTable = (CapTableReader *)uStack_678;
    reader_01._reader.segment = (SegmentReader *)allBytes_1.builder.disposer;
    reader_01._reader.data = (void *)local_670;
    reader_01._reader.pointers = (WirePointer *)uStack_668;
    reader_01._reader._32_8_ = local_660;
    reader_01._reader._40_8_ = uStack_658;
    writeConversion(this,reader_01,output);
    message_1.super_InputStreamMessageReader._300_4_ = 1;
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_620);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_520);
    kj::Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)&words.disposer);
    break;
  case FLAT_PACKED:
    readAll((Vector<unsigned_char> *)&words_1.disposer,this,input);
    AVar6 = kj::Vector::operator_cast_to_ArrayPtr((Vector *)&words_1.disposer);
    input_1.array.size_ = (size_t)AVar6.ptr;
    AVar6.ptr = AVar6.size_;
    sVar3 = computeUnpackedSizeInWords((capnp *)input_1.array.size_,AVar6);
    kj::heapArray<capnp::word>((Array<capnp::word> *)local_6b8,sVar3);
    AVar6 = kj::Vector::operator_cast_to_ArrayPtr((Vector *)&words_1.disposer);
    unpacker.inner = (BufferedInputStream *)AVar6.ptr;
    kj::ArrayInputStream::ArrayInputStream((ArrayInputStream *)local_6e0,AVar6);
    capnp::_::PackedInputStream::PackedInputStream
              ((PackedInputStream *)local_700,(BufferedInputStream *)local_6e0);
    local_710 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_6b8);
    puVar4 = kj::ArrayPtr<unsigned_char>::begin(&local_710);
    AVar7 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_6b8);
    __nbytes = AVar7.ptr;
    dummy.content = (uint64_t)__nbytes;
    __buf = (void *)kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&dummy);
    kj::InputStream::read((InputStream *)local_700,(int)puVar4,__buf,(size_t)__nbytes);
    sVar3 = capnp::_::PackedInputStream::tryRead((PackedInputStream *)local_700,&f_1,8,8);
    if (sVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&local_730,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x40e,FAILED,"unpacker.tryRead(&dummy, sizeof(dummy), sizeof(dummy)) == 0","");
      kj::_::Debug::Fault::fatal(&local_730);
    }
    AVar5 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_6b8);
    message_3.segments.size_ = (size_t)AVar5.ptr;
    kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>::ArrayPtr<1ul>
              ((ArrayPtr<kj::ArrayPtr<capnp::word_const>const> *)&local_840,
               (ArrayPtr<const_capnp::word> (*) [1])&message_3.segments.size_);
    options_01.nestingLimit = iVar2;
    options_01.traversalLimitInWords = parseErrorCatcher._376_8_;
    options_01._12_4_ = 0;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_830,local_840,options_01);
    MessageReader::getRoot<capnp::AnyStruct>
              ((Reader *)&text.content.disposer,(MessageReader *)local_830);
    reader_02._reader.capTable = (CapTableReader *)uStack_880;
    reader_02._reader.segment = (SegmentReader *)text.content.disposer;
    reader_02._reader.data = (void *)local_878;
    reader_02._reader.pointers = (WirePointer *)uStack_870;
    reader_02._reader._32_8_ = local_868;
    reader_02._reader._40_8_ = uStack_860;
    writeConversion(this,reader_02,output);
    message_1.super_InputStreamMessageReader._300_4_ = 1;
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_830);
    capnp::_::PackedInputStream::~PackedInputStream((PackedInputStream *)local_700);
    kj::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)local_6e0);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_6b8);
    kj::Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)&words_1.disposer);
    break;
  case TEXT:
    readOneText((String *)&message_4.moreSegments.builder.disposer,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)local_990,0x400,GROW_HEURISTICALLY);
    TextCodec::TextCodec((TextCodec *)&root.builder.field_0x27);
    TextCodec::setPrettyPrint((TextCodec *)&root.builder.field_0x27,(bool)(this->pretty & 1));
    local_9d0.raw = (this->rootType).super_Schema.raw;
    MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
              ((Builder *)auStack_9c8,(MessageBuilder *)local_990,(StructSchema)local_9d0.raw);
    kj::StringPtr::StringPtr
              ((StringPtr *)&local_9e0,(String *)&message_4.moreSegments.builder.disposer);
    local_9f8 = root.builder.data;
    pWStack_9f0 = root.builder.pointers;
    local_a08 = root.builder.segment;
    pCStack_a00 = root.builder.capTable;
    local_a18.raw = (RawBrandedSchema *)auStack_9c8;
    SStack_a10 = root.schema.super_Schema.raw;
    output_00.builder.segment = (SegmentBuilder *)root.schema.super_Schema.raw;
    output_00.schema.super_Schema.raw = (Schema)(Schema)auStack_9c8;
    output_00.builder.capTable = (CapTableBuilder *)root.builder.segment;
    output_00.builder.data = root.builder.capTable;
    output_00.builder.pointers = (WirePointer *)root.builder.data;
    output_00.builder._32_8_ = root.builder.pointers;
    TextCodec::decode((TextCodec *)&root.builder.field_0x27,(StringPtr)local_9e0,output_00);
    DynamicStruct::Builder::asReader((Reader *)&text_1.content.disposer,(Builder *)auStack_9c8);
    DynamicStruct::Reader::operator_cast_to_Reader(&local_a48,(Reader *)&text_1.content.disposer);
    reader_03._reader.capTable = local_a48._reader.capTable;
    reader_03._reader.segment = local_a48._reader.segment;
    reader_03._reader.data = local_a48._reader.data;
    reader_03._reader.pointers = local_a48._reader.pointers;
    reader_03._reader.dataSize = local_a48._reader.dataSize;
    reader_03._reader.pointerCount = local_a48._reader.pointerCount;
    reader_03._reader._38_2_ = local_a48._reader._38_2_;
    reader_03._reader.nestingLimit = local_a48._reader.nestingLimit;
    reader_03._reader._44_4_ = local_a48._reader._44_4_;
    writeConversion(this,reader_03,output);
    message_1.super_InputStreamMessageReader._300_4_ = 1;
    TextCodec::~TextCodec((TextCodec *)&root.builder.field_0x27);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_990);
    kj::String::~String((String *)&message_4.moreSegments.builder.disposer);
    break;
  case JSON:
    readOneJson((String *)&message_5.moreSegments.builder.disposer,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&codec_1.impl.ptr,0x400,GROW_HEURISTICALLY);
    JsonCodec::JsonCodec((JsonCodec *)local_b98);
    JsonCodec::setPrettyPrint((JsonCodec *)local_b98,(bool)(this->pretty & 1));
    root_1.builder._32_8_ = (this->rootType).super_Schema.raw;
    JsonCodec::handleByAnnotation((JsonCodec *)local_b98,(Schema)root_1.builder._32_8_);
    local_bd8.raw = (this->rootType).super_Schema.raw;
    MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
              ((Builder *)auStack_bd0,(MessageBuilder *)&codec_1.impl.ptr,
               (StructSchema)local_bd8.raw);
    local_be8 = kj::String::operator_cast_to_ArrayPtr
                          ((String *)&message_5.moreSegments.builder.disposer);
    local_bf8 = root_1.builder.data;
    pWStack_bf0 = root_1.builder.pointers;
    local_c08 = root_1.builder.segment;
    pCStack_c00 = root_1.builder.capTable;
    local_c18 = (RawBrandedSchema *)auStack_bd0;
    SStack_c10 = root_1.schema.super_Schema.raw;
    output_01.builder.segment = (SegmentBuilder *)root_1.schema.super_Schema.raw;
    output_01.schema.super_Schema.raw = (Schema)(Schema)auStack_bd0;
    output_01.builder.capTable = (CapTableBuilder *)root_1.builder.segment;
    output_01.builder.data = root_1.builder.capTable;
    output_01.builder.pointers = (WirePointer *)root_1.builder.data;
    output_01.builder._32_8_ = root_1.builder.pointers;
    JsonCodec::decode((JsonCodec *)local_b98,local_be8,output_01);
    DynamicStruct::Builder::asReader(&local_c80,(Builder *)auStack_bd0);
    DynamicStruct::Reader::operator_cast_to_Reader(&local_c48,&local_c80);
    reader_04._reader.capTable = local_c48._reader.capTable;
    reader_04._reader.segment = local_c48._reader.segment;
    reader_04._reader.data = local_c48._reader.data;
    reader_04._reader.pointers = local_c48._reader.pointers;
    reader_04._reader.dataSize = local_c48._reader.dataSize;
    reader_04._reader.pointerCount = local_c48._reader.pointerCount;
    reader_04._reader._38_2_ = local_c48._reader._38_2_;
    reader_04._reader.nestingLimit = local_c48._reader.nestingLimit;
    reader_04._reader._44_4_ = local_c48._reader._44_4_;
    writeConversion(this,reader_04,output);
    message_1.super_InputStreamMessageReader._300_4_ = 1;
    JsonCodec::~JsonCodec((JsonCodec *)local_b98);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&codec_1.impl.ptr);
    kj::String::~String((String *)&message_5.moreSegments.builder.disposer);
    break;
  default:
    kj::_::unreachable();
  }
  ParseErrorCatcher::~ParseErrorCatcher((ParseErrorCatcher *)&message.unwindDetector);
  return;
}

Assistant:

void readOneAndConvert(kj::BufferedInputStreamWrapper& input, kj::OutputStream& output) {
    // Since this is a debug tool, lift the usual security limits.  Worse case is the process
    // crashes or has to be killed.
    ReaderOptions options;
    options.nestingLimit = kj::maxValue;
    options.traversalLimitInWords = kj::maxValue;

    ParseErrorCatcher parseErrorCatcher(context);

    switch (convertFrom) {
      case Format::BINARY: {
        capnp::InputStreamMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::PACKED: {
        capnp::PackedMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT:
      case Format::CANONICAL: {
        auto allBytes = readAll(input);

        // Technically we don't know if the bytes are aligned so we'd better copy them to a new
        // array. Note that if we have a non-whole number of words we chop off the straggler
        // bytes. This is fine because if those bytes are actually part of the message we will
        // hit an error later and if they are not then who cares?
        auto words = kj::heapArray<word>(allBytes.size() / sizeof(word));
        memcpy(words.begin(), allBytes.begin(), words.size() * sizeof(word));

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        if (convertFrom == Format::CANONICAL) {
          KJ_REQUIRE(message.isCanonical());
        }
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT_PACKED: {
        auto allBytes = readAll(input);

        auto words = kj::heapArray<word>(computeUnpackedSizeInWords(allBytes));
        kj::ArrayInputStream input(allBytes);
        capnp::_::PackedInputStream unpacker(input);
        unpacker.read(words.asBytes().begin(), words.asBytes().size());
        word dummy;
        KJ_ASSERT(unpacker.tryRead(&dummy, sizeof(dummy), sizeof(dummy)) == 0);

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::TEXT: {
        auto text = readOneText(input);
        MallocMessageBuilder message;
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
      case Format::JSON: {
        auto text = readOneJson(input);
        MallocMessageBuilder message;
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
    }

    KJ_UNREACHABLE;
  }